

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Jupiter::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  size_type __len1;
  char *__name;
  ushort uVar1;
  addrinfo *__ai;
  uint uVar2;
  int iVar3;
  size_t __len2;
  Data *extraout_RAX;
  Data *pDVar4;
  undefined4 in_register_00000034;
  uint uVar5;
  addrinfo *paVar6;
  addrinfo *ptr;
  string __str;
  char local_5c;
  addrinfo *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (ushort)__addr;
  pDVar4 = this->m_data;
  __len1 = (pDVar4->bound_host)._M_string_length;
  __len2 = strlen((char *)CONCAT44(in_register_00000034,__fd));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&pDVar4->bound_host,0,__len1,(char *)CONCAT44(in_register_00000034,__fd),__len2);
  pDVar4 = this->m_data;
  pDVar4->bound_port = uVar1;
  __name = (pDVar4->bound_host)._M_dataplus._M_p;
  uVar5 = 1;
  if ((9 < uVar1) && (uVar5 = 2, 99 < uVar1)) {
    uVar2 = (uint)__addr & 0xffff;
    uVar5 = 3;
    if (999 < uVar2) {
      uVar5 = 5 - (uVar2 < 10000);
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)uVar5,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p,uVar5,(uint)__addr);
  local_58 = (addrinfo *)0x0;
  getaddrinfo(__name,local_50._M_dataplus._M_p,(addrinfo *)0x0,&local_58);
  __ai = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (__ai != (addrinfo *)0x0) {
    pDVar4 = this->m_data;
    paVar6 = __ai;
    do {
      iVar3 = socket(paVar6->ai_family,pDVar4->sockType,pDVar4->sockProto);
      pDVar4 = this->m_data;
      pDVar4->rawSock = iVar3;
      if (iVar3 != -1) {
        iVar3 = ::bind(iVar3,paVar6->ai_addr,paVar6->ai_addrlen);
        if (iVar3 != -1) {
          freeaddrinfo(__ai);
          local_5c = (char)__len;
          pDVar4 = extraout_RAX;
          if ((local_5c != '\0') && (pDVar4 = this->m_data, pDVar4->sockType == 1)) {
            uVar5 = listen(pDVar4->rawSock,0x1000);
            pDVar4 = (Data *)(ulong)uVar5;
            if (uVar5 == 0xffffffff) {
              return 0;
            }
          }
          return (int)CONCAT71((int7)((ulong)pDVar4 >> 8),1);
        }
        ::close(this->m_data->rawSock);
        pDVar4 = this->m_data;
        pDVar4->rawSock = -1;
      }
      paVar6 = paVar6->ai_next;
    } while (paVar6 != (addrinfo *)0x0);
    freeaddrinfo(__ai);
  }
  return 0;
}

Assistant:

bool Jupiter::Socket::bind(const char *hostname, unsigned short iPort, bool andListen) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init()) {
		return false;
	}
#endif // _WIN32
	m_data->bound_host = hostname;
	m_data->bound_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->bound_host.c_str(), std::to_string(m_data->bound_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
			if (m_data->rawSock == INVALID_SOCKET) {
				info = info->ai_next;
				continue;
			}

			if (::bind(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			if (andListen && m_data->sockType == SOCK_STREAM && ::listen(m_data->rawSock, SOMAXCONN) == SOCKET_ERROR) {
				return false;
			}

			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}